

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O0

void __thiscall
wasm::UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::
UniqueNonrepeatingDeferredQueue
          (UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> *this
          )

{
  UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> *this_local;
  
  UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::UniqueDeferredQueue
            (&this->super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>);
  std::
  unordered_set<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::hash<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::equal_to<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ::unordered_set(&this->processed);
  return;
}

Assistant:

void push(T item) {
    if (!processed.count(item)) {
      UniqueDeferredQueue<T>::push(item);
    }
  }